

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TalksLoader.cpp
# Opt level: O0

Expected<Talks> * __thiscall
cppti::TalksLoader::loadFrom
          (Expected<Talks> *__return_storage_ptr__,TalksLoader *this,string_view file)

{
  byte bVar1;
  allocator<char> local_2b1;
  ErrContext local_2b0;
  unexpected<cppti::ErrContext> local_288;
  allocator<char> local_249;
  string local_248 [32];
  long local_228;
  ifstream ifs;
  undefined1 local_20 [8];
  string_view file_local;
  
  file_local._M_len = file._M_len;
  local_20 = (undefined1  [8])this;
  file_local._M_str = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_248,(basic_string_view<char,_std::char_traits<char>_> *)local_20,&local_249);
  std::ifstream::ifstream(&local_228,local_248,_S_in);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator(&local_249);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar1 & 1) == 0) {
    loadFrom(__return_storage_ptr__,(istream *)&local_228);
  }
  else {
    local_2b0.code = DB_FAILED_TO_OPEN;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0.what,"Failed to open database.",&local_2b1);
    tl::unexpected<cppti::ErrContext>::unexpected(&local_288,&local_2b0);
    tl::expected<std::vector<cppti::Talk,_std::allocator<cppti::Talk>_>,_cppti::ErrContext>::
    expected<cppti::ErrContext,_nullptr,_nullptr>(__return_storage_ptr__,&local_288);
    tl::unexpected<cppti::ErrContext>::~unexpected(&local_288);
    ErrContext::~ErrContext(&local_2b0);
    std::allocator<char>::~allocator(&local_2b1);
  }
  std::ifstream::~ifstream(&local_228);
  return __return_storage_ptr__;
}

Assistant:

Expected<Talks> TalksLoader::loadFrom(std::string_view file)
{
  auto ifs = std::ifstream{std::string{file}};
  if (!ifs)
    return tl::unexpected{
        ErrContext{ErrCode::DB_FAILED_TO_OPEN, "Failed to open database."}};
  return loadFrom(ifs);
}